

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O1

bool __thiscall FString::IsInt(FString *this)

{
  int iVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  
  pbVar3 = (byte *)this->Chars;
  bVar2 = *pbVar3;
  if (bVar2 != 0) {
    pbVar3 = pbVar3 + 1;
    do {
      iVar1 = isspace((uint)bVar2);
      if (iVar1 == 0) {
        if ((bVar2 == 0x2b) || (bVar2 == 0x2d)) {
          bVar2 = *pbVar3;
          goto LAB_0056d0c5;
        }
        break;
      }
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 1;
    } while (bVar2 != 0);
    pbVar3 = pbVar3 + -1;
  }
LAB_0056d0c5:
  if (bVar2 == 0x30) {
    if ((pbVar3[1] & 0xf8) != 0x30) {
      if ((pbVar3[1] & 0xdf) == 0x58) {
        pbVar3 = pbVar3 + 2;
        bVar4 = false;
        while ((bVar2 = *pbVar3, (byte)(bVar2 - 0x30) < 10 ||
               ((bVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)
                )))) {
          pbVar3 = pbVar3 + 1;
          bVar4 = true;
        }
        if (bVar4) goto LAB_0056d108;
      }
      return false;
    }
    pbVar3 = pbVar3 + 1;
    do {
      bVar2 = pbVar3[1];
      pbVar3 = pbVar3 + 1;
    } while ((bVar2 & 0xf8) == 0x30);
  }
  else {
    if (8 < (byte)(bVar2 - 0x31)) {
      return false;
    }
    do {
      bVar2 = pbVar3[1];
      pbVar3 = pbVar3 + 1;
    } while ((byte)(bVar2 - 0x30) < 10);
  }
LAB_0056d108:
  bVar4 = bVar2 == 0;
  if (!bVar4) {
    iVar1 = isspace((uint)bVar2);
    while (iVar1 != 0) {
      pbVar3 = pbVar3 + 1;
      bVar4 = *pbVar3 == 0;
      if (bVar4) {
        return bVar4;
      }
      iVar1 = isspace((uint)*pbVar3);
    }
  }
  return bVar4;
}

Assistant:

bool FString::IsInt () const
{
	// String must match: [whitespace] [{+ | �}] [0 [{ x | X }]] [digits] [whitespace]

/* This state machine is based on a simplification of re2c's output for this input:
digits		= [0-9];
hexdigits	= [0-9a-fA-F];
octdigits	= [0-7];

("0" octdigits+ | "0" [xX] hexdigits+ | (digits \ '0') digits*) { return true; }
[\000-\377] { return false; }*/
	const char *YYCURSOR = Chars;
	char yych;

	yych = *YYCURSOR;

	// Skip preceding whitespace
	while (yych != '\0' && isspace((unsigned char)yych)) { yych = *++YYCURSOR; }

	// Check for sign
	if (yych == '+' || yych == '-') { yych = *++YYCURSOR; }

	if (yych == '0')
	{
		yych = *++YYCURSOR;
		if (yych >= '0' && yych <= '7')
		{
			do { yych = *++YYCURSOR; } while (yych >= '0' && yych <= '7');
		}
		else if (yych == 'X' || yych == 'x')
		{
			bool gothex = false;
			yych = *++YYCURSOR;
			while ((yych >= '0' && yych <= '9') || (yych >= 'A' && yych <= 'F') || (yych >= 'a' && yych <= 'f'))
			{
				gothex = true;
				yych = *++YYCURSOR;
			}
			if (!gothex) return false;
		}
		else
		{
			return false;
		}
	}
	else if (yych >= '1' && yych <= '9')
	{
		do { yych = *++YYCURSOR; } while (yych >= '0' && yych <= '9');
	}
	else
	{
		return false;
	}

	// The rest should all be whitespace
	while (yych != '\0' && isspace((unsigned char)yych)) { yych = *++YYCURSOR; }
	return yych == '\0';
}